

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

bson_type_t bson_iter_type(bson_iter_t *iter)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (iter == (bson_iter_t *)0x0) {
    pcVar2 = "iter";
    uVar1 = 0x1be;
  }
  else if (iter->raw == (uint8_t *)0x0) {
    pcVar2 = "iter->raw";
    uVar1 = 0x1bf;
  }
  else {
    if (iter->len != 0) {
      return (bson_type_t)iter->raw[iter->type];
    }
    pcVar2 = "iter->len";
    uVar1 = 0x1c0;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,uVar1,"bson_iter_type",pcVar2);
  abort();
}

Assistant:

bson_type_t
bson_iter_type (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (iter->raw);
   BSON_ASSERT (iter->len);

   return bson_iter_type_unsafe (iter);
}